

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_run_context.hpp
# Opt level: O1

void __thiscall Catch::RunContext::~RunContext(RunContext *this)

{
  IStreamingReporter *pIVar1;
  size_t sVar2;
  pointer pcVar3;
  ITracker *pIVar4;
  pointer ppIVar5;
  IConfig *pIVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long *local_88 [2];
  long local_78 [2];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 local_38;
  
  (this->super_IResultCapture)._vptr_IResultCapture = (_func_int **)&PTR__RunContext_0018eab8;
  (this->super_IRunner)._vptr_IRunner = (_func_int **)&DAT_0018eb28;
  pIVar1 = (this->m_reporter).m_p;
  sVar2 = (this->m_totals).assertions.failed;
  iVar7 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
  pcVar3 = (this->m_runInfo).name._M_dataplus._M_p;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar3,pcVar3 + (this->m_runInfo).name._M_string_length);
  local_38 = sVar2 == (long)iVar7;
  local_68 = (undefined4)(this->m_totals).assertions.passed;
  uStack_64 = *(undefined4 *)((long)&(this->m_totals).assertions.passed + 4);
  uStack_60 = (undefined4)(this->m_totals).assertions.failed;
  uStack_5c = *(undefined4 *)((long)&(this->m_totals).assertions.failed + 4);
  local_58 = (undefined4)(this->m_totals).assertions.failedButOk;
  uStack_54 = *(undefined4 *)((long)&(this->m_totals).assertions.failedButOk + 4);
  uStack_50 = (undefined4)(this->m_totals).testCases.passed;
  uStack_4c = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  local_48 = (undefined4)(this->m_totals).testCases.failed;
  uStack_44 = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  uStack_40 = (undefined4)(this->m_totals).testCases.failedButOk;
  uStack_3c = *(undefined4 *)((long)&(this->m_totals).testCases.failedButOk + 4);
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar1);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  pIVar4 = (this->m_trackerContext).m_rootTracker.m_p;
  if (pIVar4 != (ITracker *)0x0) {
    (*(pIVar4->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [3])();
  }
  ppIVar5 = (this->m_activeSections).
            super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar5 != (pointer)0x0) {
    operator_delete(ppIVar5,(long)(this->m_activeSections).
                                  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar5
                   );
  }
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::~vector
            (&this->m_unfinishedSections);
  pcVar3 = (this->m_lastAssertionInfo).capturedExpression._M_dataplus._M_p;
  paVar8 = &(this->m_lastAssertionInfo).capturedExpression.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar8) {
    operator_delete(pcVar3,paVar8->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_lastAssertionInfo).lineInfo.file._M_dataplus._M_p;
  paVar8 = &(this->m_lastAssertionInfo).lineInfo.file.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar8) {
    operator_delete(pcVar3,paVar8->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_lastAssertionInfo).macroName._M_dataplus._M_p;
  paVar8 = &(this->m_lastAssertionInfo).macroName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar8) {
    operator_delete(pcVar3,paVar8->_M_allocated_capacity + 1);
  }
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(&this->m_messages);
  pIVar1 = (this->m_reporter).m_p;
  if (pIVar1 != (IStreamingReporter *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  pIVar6 = (this->m_config).m_p;
  if (pIVar6 != (IConfig *)0x0) {
    (*(pIVar6->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  AssertionResult::~AssertionResult(&this->m_lastResult);
  pcVar3 = (this->m_runInfo).name._M_dataplus._M_p;
  paVar8 = &(this->m_runInfo).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar8) {
    operator_delete(pcVar3,paVar8->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual ~RunContext() {
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, aborting() ) );
        }